

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf-decoder.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider data;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  runtime_error *this;
  ulong uVar5;
  allocator local_2a1;
  ulong local_2a0;
  string buffer;
  string local_278;
  string filename;
  string local_238 [16];
  
  local_2a0 = 0xffffffffffffffff;
  uVar3 = 0;
  while( true ) {
    while (iVar2 = getopt_long(argc,argv,"hl:o:",main::long_options,0), iVar2 == 0x6f) {
      uVar3 = atoll(_optarg);
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x6c) {
      if (iVar2 == 0x68) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "Usage: pbf-decoder [OPTIONS] [INPUT_FILE]\n\n");
        poVar4 = std::operator<<(poVar4,"Dump raw contents of protobuf encoded file.\n");
        poVar4 = std::operator<<(poVar4,"To read from STDIN use \'-\' as INPUT_FILE.\n");
        poVar4 = std::operator<<(poVar4,"\nOptions:\n");
        poVar4 = std::operator<<(poVar4,"  -h, --help           This help message\n");
        poVar4 = std::operator<<(poVar4,"  -l, --length=LENGTH  Read only LENGTH bytes\n");
        std::operator<<(poVar4,"  -o, --offset=OFFSET  Start reading from OFFSET bytes\n");
        iVar2 = 0;
      }
      else {
LAB_001025b1:
        iVar2 = 1;
      }
      return iVar2;
    }
    local_2a0 = atoll(_optarg);
  }
  if (argc - _optind == 1) {
    std::__cxx11::string::string((string *)&filename,argv[_optind],(allocator *)local_238);
    bVar1 = std::operator==(&filename,"-");
    if (bVar1) {
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&buffer,*(undefined8 *)(*(long *)(std::cin + -0x18) + 0x108270),
                 0xffffffffffffffff,0,0xffffffff);
      uVar5 = local_2a0;
    }
    else {
      std::ifstream::ifstream(local_238,argv[_optind],_S_bin);
      uVar5 = local_2a0;
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&buffer,&local_238[0].field_2,0xffffffffffffffff,0,0xffffffff);
      std::ifstream::~ifstream(local_238);
    }
    if (uVar3 <= buffer._M_string_length) {
      if (uVar3 != 0) {
        std::__cxx11::string::erase((ulong)&buffer,0);
      }
      if (uVar5 < buffer._M_string_length) {
        std::__cxx11::string::resize((ulong)&buffer);
      }
      data._M_p = buffer._M_dataplus._M_p;
      std::__cxx11::string::string((string *)&local_278,"",&local_2a1);
      anon_unknown.dwarf_59b4::decode(local_238,data._M_p,buffer._M_string_length,&local_278);
      std::operator<<((ostream *)&std::cout,(string *)local_238);
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::string::~string((string *)&filename);
      return 0;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"offset is larger than file size");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar4 = std::operator<<(poVar4,*argv);
  poVar4 = std::operator<<(poVar4," [OPTIONS] [INPUT_FILE]\n\n");
  std::operator<<(poVar4,"Call with --help/-h to see options.\n");
  goto LAB_001025b1;
}

Assistant:

int main(int argc, char* argv[]) {
    static struct option long_options[] = {
        {"help",         no_argument, nullptr, 'h'},
        {"length", required_argument, nullptr, 'l'},
        {"offset", required_argument, nullptr, 'o'},
        {nullptr, 0, nullptr, 0}
    };

    std::size_t offset = 0;
    std::size_t length = std::numeric_limits<std::size_t>::max();

    while (true) {
        const int c = getopt_long(argc, argv, "hl:o:", long_options, nullptr); // NOLINT(concurrency-mt-unsafe) no threads here
        if (c == -1) {
            break;
        }

        switch (c) {
            case 'h':
                print_help();
                return 0;
            case 'l':
                length = std::atoll(optarg); // NOLINT(cert-err34-c)
                                             // good enough for a limited-use tool
                break;
            case 'o':
                offset = std::atoll(optarg); // NOLINT(cert-err34-c)
                                             // good enough for a limited-use tool
                break;
            default:
                return 1;
        }
    }

    const int remaining_args = argc - optind;
    if (remaining_args != 1) {
        std::cerr << "Usage: " << argv[0] << " [OPTIONS] [INPUT_FILE]\n\n"
                  << "Call with --help/-h to see options.\n";
        return 1;
    }

    const std::string filename{argv[optind]};

    try {
        std::string buffer{filename == "-" ? read_from_stdin() :
                                             read_from_file(argv[optind])};

        if (offset > buffer.size()) {
            throw std::runtime_error{"offset is larger than file size"};
        }

        if (offset > 0) {
            buffer.erase(0, offset);
        }

        if (length < buffer.size()) {
            buffer.resize(length);
        }

        std::cout << decode(buffer.data(), buffer.size(), "");
    } catch (const std::exception& ex) {
        std::cerr << ex.what() << '\n';
        return 1;
    }

    return 0;
}